

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O2

int32_t __thiscall
aeron::archive::AeronArchive::listRecording
          (AeronArchive *this,int64_t recordingId,RecordingDescriptorConsumer *consumer)

{
  int64_t iVar1;
  int64_t recordingId_local;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._8_8_ = &recordingId_local;
  local_10 = std::
             _Function_handler<bool_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp:268:9)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<bool_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp:268:9)>
             ::_M_manager;
  recordingId_local = recordingId;
  local_28._M_unused._M_object = this;
  iVar1 = callAndPollForDescriptors
                    (this,(function<bool_(long)> *)&local_28,1,consumer,"list recording");
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return (int32_t)iVar1;
}

Assistant:

std::int32_t AeronArchive::listRecording(std::int64_t recordingId, RecordingDescriptorConsumer&& consumer) {
    return callAndPollForDescriptors(
        [&](std::int64_t correlationId) {
            return this->archiveProxy_->listRecording(recordingId, correlationId, controlSessionId_);
        },
        1, std::move(consumer), "list recording");
}